

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  pointer pcVar1;
  cmState *this_00;
  ostream *poVar2;
  char *pcVar3;
  pointer ppVar4;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_ed;
  TLLSignature local_ec;
  ostream *local_e8;
  cmTarget *local_e0;
  undefined1 local_d8 [32];
  string local_b8;
  long local_98;
  string local_90;
  string local_70;
  cmOutputConverter local_50;
  
  pcVar3 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar3 = "keyword";
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"The uses of the ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,pcVar3,(ulong)(sig == KeywordTLLSignature) * 2 + 5);
  local_e8 = s;
  std::__ostream_insert<char,std::char_traits<char>>(s," signature are here:\n",0x15);
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmOutputConverter::cmOutputConverter(&local_50,(cmStateSnapshot *)local_d8);
  ppVar4 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar4 != (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_ec = sig;
    local_e0 = this;
    do {
      if (ppVar4->first == sig) {
        local_d8._0_8_ = local_d8 + 0x10;
        pcVar1 = (ppVar4->second).Name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,pcVar1,pcVar1 + (ppVar4->second).Name._M_string_length);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar1 = (ppVar4->second).FilePath._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar1,pcVar1 + (ppVar4->second).FilePath._M_string_length);
        local_98 = (ppVar4->second).Line;
        this_00 = cmMakefile::GetState(local_e0->Makefile);
        pcVar3 = cmState::GetSourceDirectory(this_00);
        std::__cxx11::string::string((string *)&local_90,pcVar3,&local_ed);
        cmOutputConverter::ConvertToRelativePath(&local_70,&local_50,&local_90,&local_b8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_e8," * ",3);
        poVar2 = operator<<(local_e8,(cmListFileContext *)local_d8);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        sig = local_ec;
        if ((cmState *)local_d8._0_8_ != (cmState *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          sig = local_ec;
        }
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != (local_e0->TLLCommands).
                       super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for (Container::const_iterator it = this->TLLCommands.begin();
       it != this->TLLCommands.end(); ++it) {
    if (it->first == sig) {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}